

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithiutil.cpp
# Opt level: O3

size_t ithi_copy_to_safe_text(char *text,size_t text_max,uint8_t *x_in,size_t l_in)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  if (text_max < 2 || l_in == 0) {
    sVar7 = 0;
  }
  else {
    bVar2 = true;
    uVar6 = 0;
    uVar4 = 1;
    uVar5 = 1;
    uVar9 = 0;
    do {
      uVar8 = uVar5;
      sVar7 = uVar4;
      bVar1 = x_in[uVar9];
      bVar10 = (byte)(bVar1 + 0x81) < 0xa2;
      if (bVar10) {
        if ((bVar1 != 0x20) || ((bool)(l_in - 1 == uVar9 | bVar2))) goto LAB_0019b7c7;
LAB_0019b7a6:
        text[uVar6] = bVar1;
        bVar2 = bVar10;
      }
      else {
        if (((0x2c < bVar1) || ((0x108400000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
           (((int)uVar8 != 1 || (bVar1 != 0x3d)))) goto LAB_0019b7a6;
LAB_0019b7c7:
        if (uVar6 + 5 < text_max) {
          text[uVar6] = '\\';
          cVar3 = (char)((uint)bVar1 * 0x29 >> 0xc);
          text[sVar7] = cVar3 + '0';
          text[uVar6 + 2] = (byte)((uint)(byte)(bVar1 + cVar3 * -100) * 0x67 >> 10) | 0x30;
          text[uVar6 + 3] = bVar1 + (bVar1 / 5 & 0xfe) * -5 | 0x30;
          sVar7 = uVar6 + 4;
        }
        else {
          text[uVar6] = '!';
        }
      }
      if (l_in <= uVar8) break;
      uVar6 = sVar7;
      uVar4 = sVar7 + 1;
      uVar5 = (ulong)((int)uVar8 + 1);
      uVar9 = uVar8;
    } while (sVar7 + 1 < text_max);
  }
  if (sVar7 < text_max) {
    text[sVar7] = '\0';
  }
  return sVar7;
}

Assistant:

size_t ithi_copy_to_safe_text(char* text, size_t text_max, uint8_t * x_in, size_t l_in)
{
    size_t text_length = 0;
    bool previous_was_space = true; /* Cannot have space at beginning */

    /* escape any non printable character */
    for (uint32_t i = 0; i < l_in && text_length + 1 < text_max; i++)
    {
        int x = x_in[i];
        bool should_escape = false;

        if (x > ' ' && x < 127 && x != '"' && x != ',' && x != '"' && x != '\''
            && (x != '=' || i > 0))
        {
            previous_was_space = false;
        }
        else if (x == ' ' && !previous_was_space && i != l_in - 1)
        {
            /* Cannot have several spaces */
            previous_was_space = true;
        }
        else
        {
            should_escape = true;
        }

        if (should_escape) {
            if (text_length + 5 < text_max) {
                text[text_length++] = '\\';
                text[text_length++] = '0' + (x / 100);
                text[text_length++] = '0' + (x % 100) / 10;
                text[text_length++] = '0' + x % 10;
            }
            else {
                text[text_length++] = '!';
            }
        }
        else {
            text[text_length++] = (char)x;
        }
    }

    if (text_length < text_max) {
        text[text_length] = 0;
    }

    return (text_length);
}